

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

Element ftxui::vtext(string *text)

{
  shared_ptr<ftxui::(anonymous_namespace)::VText> sVar1;
  Element EVar2;
  _Alloc_hider local_28;
  size_type sStack_20;
  
  sVar1 = std::make_shared<ftxui::(anonymous_namespace)::VText,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28)
  ;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<ftxui::(anonymous_namespace)::VText,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (text->_M_dataplus)._M_p = local_28._M_p;
  text->_M_string_length = sStack_20;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)text;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vtext(std::string text) {
  return std::make_shared<VText>(std::move(text));
}